

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O3

int64 __thiscall
libmatroska::KaxInternalBlock::GetDataPosition(KaxInternalBlock *this,size_t FrameNumber)

{
  int *piVar1;
  pointer piVar2;
  uint64 uVar3;
  size_t sVar4;
  
  uVar3 = 0xffffffffffffffff;
  if ((((this->super_EbmlBinary).super_EbmlElement.bValueIsSet == true) &&
      (piVar2 = (this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
      FrameNumber <
      (ulong)((long)(this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar2 >> 2))) &&
     (uVar3 = this->FirstFrameLocation, FrameNumber != 0)) {
    sVar4 = 0;
    do {
      piVar1 = piVar2 + sVar4;
      sVar4 = sVar4 + 1;
      uVar3 = uVar3 + (long)*piVar1;
    } while (FrameNumber != sVar4);
  }
  return uVar3;
}

Assistant:

int64 KaxInternalBlock::GetDataPosition(size_t FrameNumber)
{
  int64 _Result = -1;

  if (ValueIsSet() && FrameNumber < SizeList.size()) {
    _Result = FirstFrameLocation;

    size_t _Idx = 0;
    while(FrameNumber--) {
      _Result += SizeList[_Idx++];
    }
  }

  return _Result;
}